

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void google::protobuf::internal::SwapFieldHelper::SwapInlinedStrings<false>
               (Reflection *r,Message *lhs,Message *rhs,FieldDescriptor *field)

{
  ReflectionSchema *this;
  uint32_t uVar1;
  uint32_t uVar2;
  long *plVar3;
  Nonnull<const_char_*> pcVar4;
  string temp;
  LogMessageFatal local_80;
  long *local_70 [2];
  long local_60 [2];
  ulong *local_50;
  Message *local_48;
  ulong local_40;
  ulong local_38;
  
  Reflection::VerifyFieldType<google::protobuf::internal::InlinedStringField>(r,field);
  plVar3 = (long *)Reflection::MutableRawImpl(r,lhs,field);
  Reflection::VerifyFieldType<google::protobuf::internal::InlinedStringField>(r,field);
  local_50 = (ulong *)Reflection::MutableRawImpl(r,rhs,field);
  this = &r->schema_;
  uVar1 = ReflectionSchema::InlinedStringIndex(this,field);
  if (uVar1 == 0) {
    SwapInlinedStrings<false>((SwapFieldHelper *)local_70);
LAB_0042bdc5:
    SwapInlinedStrings<false>((SwapFieldHelper *)local_70);
LAB_0042bdcf:
    SwapInlinedStrings<false>((SwapFieldHelper *)local_70);
  }
  else {
    if ((r->schema_).inlined_string_donated_offset_ == -1) goto LAB_0042bdc5;
    ReflectionSchema::InlinedStringDonatedOffset(this);
    if ((r->schema_).inlined_string_donated_offset_ == -1) goto LAB_0042bdcf;
    local_48 = rhs;
    ReflectionSchema::InlinedStringDonatedOffset(this);
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char*>((string *)local_70,*plVar3,plVar3[1] + *plVar3);
    local_38 = *local_50;
    local_40 = local_50[1];
    uVar1 = ReflectionSchema::InlinedStringIndex(this,field);
    if (uVar1 != 0) {
      if ((r->schema_).inlined_string_donated_offset_ == -1) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_80,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                   ,0xbb4,"schema_.HasInlinedString()");
      }
      else {
        uVar2 = ReflectionSchema::InlinedStringDonatedOffset(this);
        anon_unknown_6::IsIndexInHasBitSet
                  ((uint32_t *)((long)&(lhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),
                   uVar1);
        std::__cxx11::string::_M_replace((ulong)plVar3,0,(char *)plVar3[1],local_38);
        plVar3 = local_70[0];
        uVar1 = ReflectionSchema::InlinedStringIndex(this,field);
        if (uVar1 == 0) {
          pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>(0,0,"index > 0u");
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    (&local_80,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                     ,0xbc3,pcVar4);
        }
        else {
          if ((r->schema_).inlined_string_donated_offset_ != -1) {
            uVar2 = ReflectionSchema::InlinedStringDonatedOffset(this);
            anon_unknown_6::IsIndexInHasBitSet
                      ((uint32_t *)
                       ((long)&(local_48->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),uVar1
                      );
            std::__cxx11::string::_M_replace((ulong)local_50,0,(char *)local_50[1],(ulong)plVar3);
            if (local_70[0] != local_60) {
              operator_delete(local_70[0],local_60[0] + 1);
            }
            return;
          }
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    (&local_80,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                     ,0xbb4,"schema_.HasInlinedString()");
        }
      }
      goto LAB_0042be6b;
    }
  }
  pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>(0,0,"index > 0u");
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_80,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
             ,0xbc3,pcVar4);
LAB_0042be6b:
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_80);
}

Assistant:

void SwapFieldHelper::SwapInlinedStrings(const Reflection* r, Message* lhs,
                                         Message* rhs,
                                         const FieldDescriptor* field) {
  // Inlined string field.
  Arena* lhs_arena = lhs->GetArena();
  Arena* rhs_arena = rhs->GetArena();
  auto* lhs_string = r->MutableRaw<InlinedStringField>(lhs, field);
  auto* rhs_string = r->MutableRaw<InlinedStringField>(rhs, field);
  uint32_t index = r->schema_.InlinedStringIndex(field);
  ABSL_DCHECK_GT(index, 0u);
  uint32_t* lhs_array = r->MutableInlinedStringDonatedArray(lhs);
  uint32_t* rhs_array = r->MutableInlinedStringDonatedArray(rhs);
  uint32_t* lhs_state = &lhs_array[index / 32];
  uint32_t* rhs_state = &rhs_array[index / 32];
  bool lhs_arena_dtor_registered = (lhs_array[0] & 0x1u) == 0;
  bool rhs_arena_dtor_registered = (rhs_array[0] & 0x1u) == 0;
  const uint32_t mask = ~(static_cast<uint32_t>(1) << (index % 32));
  if (unsafe_shallow_swap) {
    ABSL_DCHECK_EQ(lhs_arena, rhs_arena);
    InlinedStringField::InternalSwap(lhs_string, lhs_arena_dtor_registered, lhs,
                                     rhs_string, rhs_arena_dtor_registered, rhs,
                                     lhs_arena);
  } else {
    const std::string temp = lhs_string->Get();
    lhs_string->Set(rhs_string->Get(), lhs_arena,
                    r->IsInlinedStringDonated(*lhs, field), lhs_state, mask,
                    lhs);
    rhs_string->Set(temp, rhs_arena, r->IsInlinedStringDonated(*rhs, field),
                    rhs_state, mask, rhs);
  }
}